

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

AggregateFunctionSet * duckdb::ArgMaxNullFun::GetFunctions(void)

{
  AggregateFunctionSet *in_RDI;
  AggregateFunctionSet *in_stack_00000010;
  AggregateFunctionSet *fun;
  AggregateFunctionSet *in_stack_00000170;
  
  AggregateFunctionSet::AggregateFunctionSet(in_stack_00000010);
  AddArgMinMaxFunctions<duckdb::GreaterThan,false,(duckdb::OrderType)3>(in_stack_00000170);
  return in_RDI;
}

Assistant:

AggregateFunctionSet ArgMaxNullFun::GetFunctions() {
	AggregateFunctionSet fun;
	AddArgMinMaxFunctions<GreaterThan, false, OrderType::DESCENDING>(fun);
	return fun;
}